

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::iuUniversalPrinter<std::any>::Print(any *value,iu_ostream *os)

{
  type_info *ptVar1;
  size_t sVar2;
  char *__s;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"-Any type-name: ",0x10);
  ptVar1 = std::any::type(value);
  __s = *(char **)(ptVar1 + 8) + (**(char **)(ptVar1 + 8) == '*');
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
  PrintBytesInObjectTo((uchar *)value,0x10,os);
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }